

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPML_DIGEST_Unmarshal(TPML_DIGEST *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  uint uVar2;
  UINT32 UVar3;
  TPM_RC TVar4;
  ulong uVar5;
  TPM2B_DIGEST *target_00;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar4 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    target->count = UVar3;
    *buffer = *buffer + 4;
    uVar2 = target->count;
    uVar5 = (ulong)uVar2;
    TVar4 = 0x95;
    if (0xfffffff8 < uVar2 - 9) {
      TVar4 = 0;
      if (0 < (int)uVar2) {
        target_00 = target->digests;
        do {
          TVar4 = TPM2B_DIGEST_Unmarshal(target_00,buffer,size);
          if (TVar4 != 0) {
            return TVar4;
          }
          target_00 = target_00 + 1;
          uVar5 = uVar5 - 1;
          TVar4 = 0;
        } while (uVar5 != 0);
      }
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPML_DIGEST_Unmarshal(TPML_DIGEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->count < 2))
        return TPM_RC_SIZE;
    if((target->count) > 8)
        return TPM_RC_SIZE;
    result = TPM2B_DIGEST_Array_Unmarshal((TPM2B_DIGEST *)(target->digests), buffer, size, (INT32)(target->count));
    return result;
}